

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O3

void __thiscall Diligent::GLContextState::SetActiveTexture(GLContextState *this,Int32 Index)

{
  int iVar1;
  Int32 IVar2;
  Int32 Index_local;
  GLenum err;
  string msg;
  
  iVar1 = (this->m_Caps).MaxCombinedTexUnits;
  Index_local = Index;
  if (Index < 0) {
    Index_local = Index + iVar1;
  }
  IVar2 = Index_local;
  if (Index_local < 0 || iVar1 <= Index_local) {
    FormatString<char[29]>(&msg,(char (*) [29])"Texture unit is out of range");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SetActiveTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0xcd);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->m_iActiveTexture != IVar2) {
    (*__glewActiveTexture)(IVar2 + 0x84c0);
    err = glGetError();
    if (err != 0) {
      LogError<false,char[33],int,char[17],unsigned_int>
                (false,"SetActiveTexture",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0xd2,(char (*) [33])"Failed to activate texture slot ",&Index_local,
                 (char (*) [17])"\nGL Error Code: ",&err);
      FormatString<char[6]>(&msg,(char (*) [6])0x32e52e);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"SetActiveTexture",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0xd2);
      IVar2 = Index_local;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        IVar2 = Index_local;
      }
    }
    this->m_iActiveTexture = IVar2;
  }
  return;
}

Assistant:

void GLContextState::SetActiveTexture(Int32 Index)
{
    if (Index < 0)
    {
        Index += m_Caps.MaxCombinedTexUnits;
    }
    VERIFY(0 <= Index && Index < m_Caps.MaxCombinedTexUnits, "Texture unit is out of range");

    if (m_iActiveTexture != Index)
    {
        glActiveTexture(GL_TEXTURE0 + Index);
        DEV_CHECK_GL_ERROR("Failed to activate texture slot ", Index);
        m_iActiveTexture = Index;
    }
}